

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum64.c
# Opt level: O3

uint64_t Hacl_Bignum64_lt_mask(uint32_t len,uint64_t *a,uint64_t *b)

{
  uint64_t b_00;
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (len != 0) {
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar2 = a[uVar4];
      b_00 = b[uVar4];
      uVar1 = FStar_UInt64_eq_mask(uVar2,b_00);
      uVar2 = FStar_UInt64_gte_mask(uVar2,b_00);
      uVar3 = ~(uVar2 | uVar1) | uVar3 & uVar1;
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
    return uVar3;
  }
  return 0;
}

Assistant:

uint64_t Hacl_Bignum64_lt_mask(uint32_t len, uint64_t *a, uint64_t *b)
{
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(a[i], b[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(a[i], b[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  return acc;
}